

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDAGetNumGEvals(void *ida_mem,long *ngevals)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x4f9,"IDAGetNumGEvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *ngevals = *(long *)((long)ida_mem + 0x498);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetNumGEvals(void* ida_mem, long int* ngevals)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *ngevals = IDA_mem->ida_nge;

  return (IDA_SUCCESS);
}